

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

int setElementTypePrefix(XML_Parser parser,ELEMENT_TYPE *elementType)

{
  XML_Char XVar1;
  DTD *pDVar2;
  XML_Char *pXVar3;
  XML_Bool XVar4;
  PREFIX *pPVar5;
  PREFIX *local_40;
  XML_Char *s;
  PREFIX *prefix;
  XML_Char *name;
  DTD *dtd;
  ELEMENT_TYPE *elementType_local;
  XML_Parser parser_local;
  
  pDVar2 = parser->m_dtd;
  prefix = (PREFIX *)elementType->name;
  while( true ) {
    if (*(char *)&prefix->name == '\0') {
      return 1;
    }
    if (*(char *)&prefix->name == ':') break;
    prefix = (PREFIX *)((long)&prefix->name + 1);
  }
  for (local_40 = (PREFIX *)elementType->name; local_40 != prefix;
      local_40 = (PREFIX *)((long)&local_40->name + 1)) {
    if (((pDVar2->pool).ptr == (pDVar2->pool).end) &&
       (XVar4 = poolGrow(&pDVar2->pool), XVar4 == '\0')) {
      return 0;
    }
    XVar1 = *(XML_Char *)&local_40->name;
    pXVar3 = (pDVar2->pool).ptr;
    (pDVar2->pool).ptr = pXVar3 + 1;
    *pXVar3 = XVar1;
  }
  if (((pDVar2->pool).ptr == (pDVar2->pool).end) && (XVar4 = poolGrow(&pDVar2->pool), XVar4 == '\0')
     ) {
    return 0;
  }
  pXVar3 = (pDVar2->pool).ptr;
  (pDVar2->pool).ptr = pXVar3 + 1;
  *pXVar3 = '\0';
  pPVar5 = (PREFIX *)lookup(parser,&pDVar2->prefixes,(pDVar2->pool).start,0x10);
  if (pPVar5 != (PREFIX *)0x0) {
    if (pPVar5->name == (pDVar2->pool).start) {
      (pDVar2->pool).start = (pDVar2->pool).ptr;
    }
    else {
      (pDVar2->pool).ptr = (pDVar2->pool).start;
    }
    elementType->prefix = pPVar5;
    return 1;
  }
  return 0;
}

Assistant:

static int
setElementTypePrefix(XML_Parser parser, ELEMENT_TYPE *elementType)
{
  DTD * const dtd = parser->m_dtd;  /* save one level of indirection */
  const XML_Char *name;
  for (name = elementType->name; *name; name++) {
    if (*name == XML_T(ASCII_COLON)) {
      PREFIX *prefix;
      const XML_Char *s;
      for (s = elementType->name; s != name; s++) {
        if (!poolAppendChar(&dtd->pool, *s))
          return 0;
      }
      if (!poolAppendChar(&dtd->pool, XML_T('\0')))
        return 0;
      prefix = (PREFIX *)lookup(parser, &dtd->prefixes, poolStart(&dtd->pool),
                                sizeof(PREFIX));
      if (!prefix)
        return 0;
      if (prefix->name == poolStart(&dtd->pool))
        poolFinish(&dtd->pool);
      else
        poolDiscard(&dtd->pool);
      elementType->prefix = prefix;
      break;
    }
  }
  return 1;
}